

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_o1.cc
# Opt level: O3

vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
* __thiscall
lf::geometry::Parallelogram::ChildGeometry
          (vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
           *__return_storage_ptr__,Parallelogram *this,RefinementPattern *ref_pat,dim_t codim)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  double *pdVar3;
  uint uVar4;
  double dVar5;
  void *pvVar6;
  bool bVar7;
  int iVar8;
  TriaO1 *pTVar9;
  runtime_error *prVar10;
  ostream *poVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  MatrixXd child_geo;
  vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  child_polygons;
  stringstream ss;
  string local_278;
  string local_258;
  string local_238;
  dim_t local_218;
  scalar_product_op<double,_double> local_211;
  vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
  *local_210;
  void *local_208 [3];
  vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  local_1f0;
  _func_int **local_1d8;
  ulong local_1d0;
  double local_1c8;
  scalar_constant_op<double> local_1c0;
  undefined1 local_1b8 [392];
  
  if ((ref_pat->ref_el_).type_ != kQuad) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"Refinement pattern for ",0x17);
    local_258._M_dataplus._M_p._0_1_ = (ref_pat->ref_el_).type_;
    base::RefEl::ToString_abi_cxx11_(&local_278,(RefEl *)&local_258);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),local_278._M_dataplus._M_p,local_278._M_string_length);
    paVar1 = &local_278.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar1) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    local_278._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_278,"ref_pat.RefEl() == lf::base::RefEl::kQuad()","");
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_258,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_278,&local_258,0x163,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar1) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"this code should not be reached");
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_218 = codim;
  if (2 < codim) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"Illegal codim ",0xe);
    std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"codim < 3","");
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_258,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_278,&local_258,0x166,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"this code should not be reached");
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar4 = ref_pat->lattice_const_;
  (*ref_pat->_vptr_RefinementPattern[1])(&local_1f0,ref_pat,(ulong)codim);
  lVar13 = (long)local_1f0.
                 super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_1f0.
                 super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  iVar8 = (**ref_pat->_vptr_RefinementPattern)(ref_pat,(ulong)codim);
  uVar15 = (lVar13 >> 3) * -0x5555555555555555;
  iVar14 = (int)uVar15;
  if (iVar8 != iVar14) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"no_children = ",0xe);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," <-> ",5);
    (**ref_pat->_vptr_RefinementPattern)(ref_pat,(ulong)local_218);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    paVar1 = &local_278.field_2;
    local_278._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_278,"no_children == ref_pat.NumChildren(codim)","");
    paVar2 = &local_258.field_2;
    local_258._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_258,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_278,&local_258,0x172,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar1) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    local_278._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"false","");
    local_258._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_258,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
               ,"");
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"");
    base::AssertionFailed(&local_278,&local_258,0x172,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_278);
    abort();
  }
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (iVar14 != 0) {
    local_1c8 = 1.0 / (double)uVar4;
    local_1d0 = uVar15 & 0xffffffff;
    uVar15 = 0;
    local_1d8 = (_func_int **)&PTR_DimLocal_002d96d0;
    local_210 = (vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
                 *)__return_storage_ptr__;
    do {
      if (local_1f0.
          super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar15].
          super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>.m_storage.m_rows != 2) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),"child_polygons[",0xf);
        poVar11 = (ostream *)std::ostream::operator<<((ostream *)(local_1b8 + 0x10),(int)uVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"].rows() = ",0xb);
        std::ostream::_M_insert<long>((long)poVar11);
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,"child_polygons[l].rows() == 2","");
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_258,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_278,&local_258,0x17c,&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"this code should not be reached");
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_238._M_dataplus._M_p =
           (pointer)(local_1f0.
                     super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar15);
      local_1c0.m_other = local_1c8;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
      ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                        *)&local_278,2,
                       (((pointer)local_238._M_dataplus._M_p)->
                       super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>).m_storage.
                       m_cols,&local_1c0);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                       *)local_1b8,(Lhs *)&local_278,(Rhs *)&local_238,&local_211);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::Matrix<int,_1,_1,0,_1,_1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_258,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>_>
                  *)local_1b8);
      (*(this->super_Geometry)._vptr_Geometry[3])(local_208,this,&local_258);
      free(local_258._M_dataplus._M_p);
      if (local_218 == 0) {
        lVar13 = local_1f0.
                 super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar15].
                 super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
        if (lVar13 == 4) {
          bVar7 = isParallelogram(local_1f0.
                                  super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar15);
          if (bVar7) {
            std::make_unique<lf::geometry::Parallelogram,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                      ((Matrix<double,__1,__1,_0,__1,__1> *)&local_278);
            local_1b8._0_8_ = local_278._M_dataplus._M_p;
            local_278._M_dataplus._M_p = (pointer)0x0;
            std::
            vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
            ::
            emplace_back<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>
                      ((vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
                        *)__return_storage_ptr__,
                       (unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                        *)local_1b8);
          }
          else {
            std::make_unique<lf::geometry::QuadO1,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                      ((Matrix<double,__1,__1,_0,__1,__1> *)&local_278);
            local_1b8._0_8_ = local_278._M_dataplus._M_p;
            local_278._M_dataplus._M_p = (pointer)0x0;
            std::
            vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
            ::
            emplace_back<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>
                      ((vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
                        *)__return_storage_ptr__,
                       (unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                        *)local_1b8);
          }
          goto LAB_001aacea;
        }
        if (lVar13 != 3) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b8 + 0x10),"child_polygons[",0xf);
          poVar11 = (ostream *)std::ostream::operator<<((ostream *)(local_1b8 + 0x10),(int)uVar15);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"].cols() = ",0xb);
          std::ostream::_M_insert<long>((long)poVar11);
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"false","");
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_258,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                     ,"");
          std::__cxx11::stringbuf::str();
          base::AssertionFailed(&local_278,&local_258,0x198,&local_238);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar10,"this code should not be reached");
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pTVar9 = (TriaO1 *)operator_new(0x40);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,3,0,-1,3>>::
        PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,3,0,_1,3>> *)local_1b8,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_208);
        TriaO1::TriaO1(pTVar9,(Matrix<double,__1,_3,_0,__1,_3> *)local_1b8);
        free((void *)local_1b8._0_8_);
        local_278._M_dataplus._M_p = (pointer)pTVar9;
        std::
        vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
        ::
        emplace_back<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>
                  ((vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
                    *)__return_storage_ptr__,
                   (unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                    *)&local_278);
      }
      else if (local_218 == 1) {
        if (local_1f0.
            super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar15].
            super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>.m_storage.m_cols != 2) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b8 + 0x10),"child_polygons[l].cols() = ",0x1b);
          std::ostream::_M_insert<long>((long)(local_1b8 + 0x10));
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_278,"child_polygons[l].cols() == 2","");
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_258,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                     ,"");
          std::__cxx11::stringbuf::str();
          base::AssertionFailed(&local_278,&local_258,0x1a0,&local_238);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar10,"this code should not be reached");
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::make_unique<lf::geometry::SegmentO1,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)&local_278);
        local_1b8._0_8_ = local_278._M_dataplus._M_p;
        local_278._M_dataplus._M_p = (pointer)0x0;
        std::
        vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
        ::
        emplace_back<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>
                  ((vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
                    *)__return_storage_ptr__,
                   (unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                    *)local_1b8);
LAB_001aacea:
        if ((TriaO1 *)local_1b8._0_8_ != (TriaO1 *)0x0) {
          (*((Geometry *)local_1b8._0_8_)->_vptr_Geometry[0xb])();
        }
        local_1b8._0_8_ = (double *)0x0;
      }
      else {
        if (local_1f0.
            super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar15].
            super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>.m_storage.m_cols != 1) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b8 + 0x10),"child_polygons[l].cols() = ",0x1b);
          std::ostream::_M_insert<long>((long)(local_1b8 + 0x10));
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_278,"child_polygons[l].cols() == 1","");
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_258,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                     ,"");
          std::__cxx11::stringbuf::str();
          base::AssertionFailed(&local_278,&local_258,0x1a7,&local_238);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar10,"this code should not be reached");
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pTVar9 = (TriaO1 *)operator_new(0x18);
        local_1b8._0_8_ = (double *)0x0;
        local_1b8._8_8_ = 0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        resizeLike<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_1b8,
                   (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_208);
        pvVar6 = local_208[0];
        Eigen::internal::
        resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,double,double>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)local_1b8,
                   (Matrix<double,__1,__1,_0,__1,__1> *)local_208,
                   (assign_op<double,_double> *)&local_258);
        __return_storage_ptr__ =
             (vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
              *)local_210;
        uVar12 = local_1b8._8_8_ - ((long)local_1b8._8_8_ >> 0x3f) & 0xfffffffffffffffe;
        if (1 < (long)local_1b8._8_8_) {
          lVar13 = 0;
          do {
            pdVar3 = (double *)((long)pvVar6 + lVar13 * 8);
            dVar5 = pdVar3[1];
            *(double *)(local_1b8._0_8_ + lVar13 * 8) = *pdVar3;
            ((double *)(local_1b8._0_8_ + lVar13 * 8))[1] = dVar5;
            lVar13 = lVar13 + 2;
          } while (lVar13 < (long)uVar12);
        }
        if ((long)uVar12 < (long)local_1b8._8_8_) {
          do {
            *(double *)(local_1b8._0_8_ + uVar12 * 8) = *(double *)((long)pvVar6 + uVar12 * 8);
            uVar12 = uVar12 + 1;
          } while (local_1b8._8_8_ != uVar12);
        }
        (pTVar9->super_Geometry)._vptr_Geometry = local_1d8;
        (pTVar9->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
        m_data = (double *)local_1b8._0_8_;
        (pTVar9->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
        m_rows = local_1b8._8_8_;
        local_278._M_dataplus._M_p = (pointer)pTVar9;
        std::
        vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
        ::
        emplace_back<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>
                  (local_210,
                   (unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                    *)&local_278);
      }
      if ((TriaO1 *)local_278._M_dataplus._M_p != (TriaO1 *)0x0) {
        (**(code **)(*(long *)local_278._M_dataplus._M_p + 0x58))();
      }
      free(local_208[0]);
      uVar15 = uVar15 + 1;
    } while (uVar15 != local_1d0);
  }
  std::
  vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
  ::~vector(&local_1f0);
  return (vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
          *)(vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
             *)__return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<Geometry>> Parallelogram::ChildGeometry(
    const RefinementPattern& ref_pat, lf::base::dim_t codim) const {
  // The refinement pattern must be for a quadrilateral
  LF_VERIFY_MSG(ref_pat.RefEl() == lf::base::RefEl::kQuad(),
                "Refinement pattern for " << ref_pat.RefEl().ToString());
  // Allowed condimensions:
  // 0 -> child cells, 1-> child edges, 2 -> child points
  LF_VERIFY_MSG(codim < 3, "Illegal codim " << codim);

  // Lattice meshwidth
  const double h_lattice = 1.0 / static_cast<double>(ref_pat.LatticeConst());
  // Obtain geometry of children as lattice polygons
  std::vector<Eigen::Matrix<int, Eigen::Dynamic, Eigen::Dynamic>>
      child_polygons(ref_pat.ChildPolygons(codim));
  // Number of child segments
  const base::size_type no_children = child_polygons.size();
  // Check consistency of data
  LF_ASSERT_MSG(
      no_children == ref_pat.NumChildren(codim),
      "no_children = " << no_children << " <-> " << ref_pat.NumChildren(codim));

  // Variable for returning (unique pointers to) child geometries
  std::vector<std::unique_ptr<Geometry>> child_geo_uptrs{};
  // For each child entity create a geometry object and a unique pointer to it.
  for (int l = 0; l < no_children; l++) {
    // A single child entity is described by a lattice polygon with
    // a certain number of corners
    LF_VERIFY_MSG(
        child_polygons[l].rows() == 2,
        "child_polygons[" << l << "].rows() = " << child_polygons[l].rows());
    // Obtain physical (world) coordinates of the vertices of
    // of the child entities after normalizing lattice coordinates
    const Eigen::MatrixXd child_geo(
        Global(h_lattice * child_polygons[l].cast<double>()));
    // Treat child entities of different dimension
    switch (codim) {
      case 0: {  // Child cells
        if (child_polygons[l].cols() == 3) {
          // Child cell is a triangle
          child_geo_uptrs.push_back(std::make_unique<TriaO1>(child_geo));
        } else if (child_polygons[l].cols() == 4) {
          // Child cell is a quadrilateral
          ////////////////////////////////////////////////////
          // Code specific for a parallleogram
          // If the lattice polygon is a parallelogram
          // then create another parallelogram, otherwise
          // a general quadrilateral
          if (isParallelogram(child_polygons[l])) {
            // Child cell is parallelogram as well
            child_geo_uptrs.push_back(
                std::make_unique<Parallelogram>(child_geo));
          } else {
            // General quadrilateral
            child_geo_uptrs.push_back(std::make_unique<QuadO1>(child_geo));
          }
        } else {
          LF_VERIFY_MSG(false, "child_polygons[" << l << "].cols() = "
                                                 << child_polygons[l].cols());
        }
        break;
      }
      case 1: {
        // Child is an edge
        LF_VERIFY_MSG(
            child_polygons[l].cols() == 2,
            "child_polygons[l].cols() = " << child_polygons[l].cols());
        child_geo_uptrs.push_back(std::make_unique<SegmentO1>(child_geo));
        break;
      }
      case 2: {
        LF_VERIFY_MSG(
            child_polygons[l].cols() == 1,
            "child_polygons[l].cols() = " << child_polygons[l].cols());
        child_geo_uptrs.push_back(std::make_unique<Point>(child_geo));
        break;
      }
      default: {
        LF_VERIFY_MSG(false, "Illegal co-dimension");
        break;
      }
    }  // end switch codim
  }  // end loop over children
  return (child_geo_uptrs);
}